

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int mbedtls_chacha20_crypt
              (uchar *key,uchar *nonce,uint32_t counter,size_t data_len,uchar *input,uchar *output)

{
  int local_c4;
  undefined1 local_c0 [4];
  int ret;
  mbedtls_chacha20_context ctx;
  uchar *output_local;
  uchar *input_local;
  size_t data_len_local;
  uint32_t counter_local;
  uchar *nonce_local;
  uchar *key_local;
  
  ctx.keystream_bytes_used = (size_t)output;
  mbedtls_chacha20_init((mbedtls_chacha20_context *)local_c0);
  local_c4 = mbedtls_chacha20_setkey((mbedtls_chacha20_context *)local_c0,key);
  if ((local_c4 == 0) &&
     (local_c4 = mbedtls_chacha20_starts((mbedtls_chacha20_context *)local_c0,nonce,counter),
     local_c4 == 0)) {
    local_c4 = mbedtls_chacha20_update
                         ((mbedtls_chacha20_context *)local_c0,data_len,input,
                          (uchar *)ctx.keystream_bytes_used);
  }
  mbedtls_chacha20_free((mbedtls_chacha20_context *)local_c0);
  return local_c4;
}

Assistant:

int mbedtls_chacha20_crypt( const unsigned char key[32],
                            const unsigned char nonce[12],
                            uint32_t counter,
                            size_t data_len,
                            const unsigned char* input,
                            unsigned char* output )
{
    mbedtls_chacha20_context ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    CHACHA20_VALIDATE_RET( key != NULL );
    CHACHA20_VALIDATE_RET( nonce != NULL );
    CHACHA20_VALIDATE_RET( data_len == 0 || input  != NULL );
    CHACHA20_VALIDATE_RET( data_len == 0 || output != NULL );

    mbedtls_chacha20_init( &ctx );

    ret = mbedtls_chacha20_setkey( &ctx, key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chacha20_starts( &ctx, nonce, counter );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chacha20_update( &ctx, data_len, input, output );

cleanup:
    mbedtls_chacha20_free( &ctx );
    return( ret );
}